

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_portaldata.cpp
# Opt level: O0

void Cmd_dumpportals(FCommandLine *argv,APlayerPawn *who,int key)

{
  double dVar1;
  double dVar2;
  sector_t *this;
  char *pcVar3;
  subsector_t *psVar4;
  uint uVar5;
  FPortal **ppFVar6;
  FPortal *pFVar7;
  FPortalCoverage *pFVar8;
  double dVar9;
  double dVar10;
  uint local_6c;
  uint m;
  subsector_t *csub;
  int l;
  FPortalCoverage *cov;
  uint k;
  FPortal *port;
  subsector_t *sub;
  int j;
  double ydisp;
  double xdisp;
  uint i;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  for (xdisp._0_4_ = 0; uVar5 = TArray<FPortal_*,_FPortal_*>::Size(&portals), xdisp._0_4_ < uVar5;
      xdisp._0_4_ = xdisp._0_4_ + 1) {
    ppFVar6 = TArray<FPortal_*,_FPortal_*>::operator[](&portals,(ulong)xdisp._0_4_);
    dVar1 = ((*ppFVar6)->mDisplacement).X;
    ppFVar6 = TArray<FPortal_*,_FPortal_*>::operator[](&portals,(ulong)xdisp._0_4_);
    dVar2 = ((*ppFVar6)->mDisplacement).Y;
    ppFVar6 = TArray<FPortal_*,_FPortal_*>::operator[](&portals,(ulong)xdisp._0_4_);
    pcVar3 = "Alphaceiling";
    if ((*ppFVar6)->plane == 0) {
      pcVar3 = "Alphafloor";
    }
    Printf(5,"Portal #%d, %s, displacement = (%f,%f)\n",dVar1,dVar2,(ulong)xdisp._0_4_,pcVar3 + 5);
    Printf(5,"Coverage:\n");
    for (sub._4_4_ = 0; psVar4 = subsectors, (int)sub._4_4_ < numsubsectors;
        sub._4_4_ = sub._4_4_ + 1) {
      this = subsectors[(int)sub._4_4_].render_sector;
      ppFVar6 = TArray<FPortal_*,_FPortal_*>::operator[](&portals,(ulong)xdisp._0_4_);
      pFVar7 = sector_t::GetGLPortal(this,(*ppFVar6)->plane);
      ppFVar6 = TArray<FPortal_*,_FPortal_*>::operator[](&portals,(ulong)xdisp._0_4_);
      if (pFVar7 == *ppFVar6) {
        Printf(5,"\tSubsector %d (%d):\n\t\t",(ulong)sub._4_4_,
               (ulong)(uint)(psVar4[(int)sub._4_4_].render_sector)->sectornum);
        for (cov._4_4_ = 0; cov._4_4_ < psVar4[(int)sub._4_4_].numlines; cov._4_4_ = cov._4_4_ + 1)
        {
          dVar9 = vertex_t::fX(psVar4[(int)sub._4_4_].firstline[cov._4_4_].v1);
          dVar10 = vertex_t::fY(psVar4[(int)sub._4_4_].firstline[cov._4_4_].v1);
          Printf(5,"(%.3f,%.3f), ",dVar9 + dVar1,dVar10 + dVar2);
        }
        Printf(5,"\n\t\tCovered by subsectors:\n");
        ppFVar6 = TArray<FPortal_*,_FPortal_*>::operator[](&portals,(ulong)xdisp._0_4_);
        pFVar8 = psVar4[(int)sub._4_4_].portalcoverage + (*ppFVar6)->plane;
        for (csub._4_4_ = 0; psVar4 = subsectors, csub._4_4_ < pFVar8->sscount;
            csub._4_4_ = csub._4_4_ + 1) {
          uVar5 = pFVar8->subsectors[csub._4_4_];
          Printf(5,"\t\t\t%5d (%4d): ",(ulong)pFVar8->subsectors[csub._4_4_],
                 (ulong)(uint)(subsectors[uVar5].render_sector)->sectornum);
          for (local_6c = 0; local_6c < psVar4[uVar5].numlines; local_6c = local_6c + 1) {
            dVar9 = vertex_t::fX(psVar4[uVar5].firstline[local_6c].v1);
            dVar10 = vertex_t::fY(psVar4[uVar5].firstline[local_6c].v1);
            Printf(5,"(%.3f,%.3f), ",dVar9,dVar10);
          }
          Printf(5,"\n");
        }
      }
    }
  }
  return;
}

Assistant:

CCMD(dumpportals)
{
	for(unsigned i=0;i<portals.Size(); i++)
	{
		double xdisp = portals[i]->mDisplacement.X;
		double ydisp = portals[i]->mDisplacement.Y;
		Printf(PRINT_LOG, "Portal #%d, %s, displacement = (%f,%f)\n", i, portals[i]->plane==0? "floor":"ceiling",
			xdisp, ydisp);
		Printf(PRINT_LOG, "Coverage:\n");
		for(int j=0;j<numsubsectors;j++)
		{
			subsector_t *sub = &subsectors[j];
			FPortal *port = sub->render_sector->GetGLPortal(portals[i]->plane);
			if (port == portals[i])
			{
				Printf(PRINT_LOG, "\tSubsector %d (%d):\n\t\t", j, sub->render_sector->sectornum);
				for(unsigned k = 0;k< sub->numlines; k++)
				{
					Printf(PRINT_LOG, "(%.3f,%.3f), ",	sub->firstline[k].v1->fX() + xdisp, sub->firstline[k].v1->fY() + ydisp);
				}
				Printf(PRINT_LOG, "\n\t\tCovered by subsectors:\n");
				FPortalCoverage *cov = &sub->portalcoverage[portals[i]->plane];
				for(int l = 0;l< cov->sscount; l++)
				{
					subsector_t *csub = &subsectors[cov->subsectors[l]];
					Printf(PRINT_LOG, "\t\t\t%5d (%4d): ", cov->subsectors[l], csub->render_sector->sectornum);
					for(unsigned m = 0;m< csub->numlines; m++)
					{
						Printf(PRINT_LOG, "(%.3f,%.3f), ",	csub->firstline[m].v1->fX(), csub->firstline[m].v1->fY());
					}
					Printf(PRINT_LOG, "\n");
				}
			}
		}
	}
}